

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simSupp.c
# Opt level: O3

Vec_Ptr_t * Sim_ComputeStrSupp(Abc_Ntk_t *pNtk)

{
  uint *puVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  void **ppvVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  Vec_Ptr_t *pVVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  
  uVar10 = pNtk->vCis->nSize;
  uVar10 = (((int)uVar10 >> 5) + 1) - (uint)((uVar10 & 0x1f) == 0);
  pVVar8 = Sim_UtilInfoAlloc(pNtk->vObjs->nSize,uVar10,1);
  pVVar2 = pNtk->vCis;
  if (0 < pVVar2->nSize) {
    ppvVar3 = pVVar2->pArray;
    ppvVar4 = pVVar8->pArray;
    uVar9 = 0;
    do {
      puVar1 = (uint *)((long)ppvVar4[*(int *)((long)ppvVar3[uVar9] + 0x10)] +
                       (uVar9 >> 5 & 0x7ffffff) * 4);
      *puVar1 = *puVar1 | 1 << ((byte)uVar9 & 0x1f);
      uVar9 = uVar9 + 1;
    } while ((long)uVar9 < (long)pVVar2->nSize);
  }
  pVVar2 = pNtk->vObjs;
  iVar12 = pVVar2->nSize;
  if (0 < iVar12) {
    ppvVar3 = pVVar2->pArray;
    lVar11 = 0;
    do {
      pvVar5 = ppvVar3[lVar11];
      if (((pvVar5 != (void *)0x0) && ((*(uint *)((long)pvVar5 + 0x14) & 0xf) == 7)) &&
         (0 < (int)uVar10)) {
        ppvVar4 = pVVar8->pArray;
        pvVar6 = ppvVar4[*(int *)((long)pvVar5 + 0x10)];
        pvVar7 = ppvVar4[**(int **)((long)pvVar5 + 0x20)];
        pvVar5 = ppvVar4[(*(int **)((long)pvVar5 + 0x20))[1]];
        uVar9 = 0;
        do {
          *(uint *)((long)pvVar6 + uVar9 * 4) =
               *(uint *)((long)pvVar5 + uVar9 * 4) | *(uint *)((long)pvVar7 + uVar9 * 4);
          uVar9 = uVar9 + 1;
        } while (uVar10 != uVar9);
        iVar12 = pVVar2->nSize;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < iVar12);
  }
  pVVar2 = pNtk->vCos;
  iVar12 = pVVar2->nSize;
  if (0 < iVar12) {
    ppvVar3 = pVVar2->pArray;
    ppvVar4 = pVVar8->pArray;
    lVar11 = 0;
    do {
      if (0 < (int)uVar10) {
        pvVar5 = ppvVar4[*(int *)((long)ppvVar3[lVar11] + 0x10)];
        pvVar6 = ppvVar4[**(int **)((long)ppvVar3[lVar11] + 0x20)];
        uVar9 = 0;
        do {
          *(undefined4 *)((long)pvVar5 + uVar9 * 4) = *(undefined4 *)((long)pvVar6 + uVar9 * 4);
          uVar9 = uVar9 + 1;
        } while (uVar10 != uVar9);
        iVar12 = pVVar2->nSize;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < iVar12);
  }
  return pVVar8;
}

Assistant:

Vec_Ptr_t * Sim_ComputeStrSupp( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vSuppStr;
    Abc_Obj_t * pNode;
    unsigned * pSimmNode, * pSimmNode1, * pSimmNode2;
    int nSuppWords, i, k;
    // allocate room for structural supports
    nSuppWords = SIM_NUM_WORDS( Abc_NtkCiNum(pNtk) );
    vSuppStr   = Sim_UtilInfoAlloc( Abc_NtkObjNumMax(pNtk), nSuppWords, 1 );
    // assign the structural support to the PIs
    Abc_NtkForEachCi( pNtk, pNode, i )
        Sim_SuppStrSetVar( vSuppStr, pNode, i );
    // derive the structural supports of the internal nodes
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
//        if ( Abc_NodeIsConst(pNode) )
//            continue;
        pSimmNode  = (unsigned *)vSuppStr->pArray[ pNode->Id ];
        pSimmNode1 = (unsigned *)vSuppStr->pArray[ Abc_ObjFaninId0(pNode) ];
        pSimmNode2 = (unsigned *)vSuppStr->pArray[ Abc_ObjFaninId1(pNode) ];
        for ( k = 0; k < nSuppWords; k++ )
            pSimmNode[k] = pSimmNode1[k] | pSimmNode2[k];
    }
    // set the structural supports of the PO nodes
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        pSimmNode  = (unsigned *)vSuppStr->pArray[ pNode->Id ];
        pSimmNode1 = (unsigned *)vSuppStr->pArray[ Abc_ObjFaninId0(pNode) ];
        for ( k = 0; k < nSuppWords; k++ )
            pSimmNode[k] = pSimmNode1[k];
    }
    return vSuppStr;
}